

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_close_sockets.c
# Opt level: O0

void ares_check_cleanup_conns(ares_channel_t *channel)

{
  bool bVar1;
  void *pvVar2;
  ares_llist_node_t *paVar3;
  ares_conn_t *conn_00;
  size_t sVar4;
  ares_bool_t do_cleanup;
  ares_conn_t *conn;
  ares_llist_node_t *next;
  ares_llist_node_t *cnode;
  ares_server_t *server;
  ares_slist_node_t *snode;
  ares_channel_t *channel_local;
  
  if (channel != (ares_channel_t *)0x0) {
    for (server = (ares_server_t *)ares_slist_node_first(channel->servers);
        server != (ares_server_t *)0x0;
        server = (ares_server_t *)ares_slist_node_next((ares_slist_node_t *)server)) {
      pvVar2 = ares_slist_node_val((ares_slist_node_t *)server);
      next = ares_llist_node_first(*(ares_llist_t **)((long)pvVar2 + 0x78));
      while (next != (ares_llist_node_t *)0x0) {
        paVar3 = ares_llist_node_next(next);
        conn_00 = (ares_conn_t *)ares_llist_node_val(next);
        sVar4 = ares_llist_len(conn_00->queries_to_conn);
        next = paVar3;
        if (sVar4 == 0) {
          bVar1 = conn_00->server->consec_failures != 0 || (channel->flags & 0x10) == 0;
          if ((((conn_00->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) &&
              (channel->udp_max_queries != 0)) &&
             (channel->udp_max_queries <= conn_00->total_queries)) {
            bVar1 = true;
          }
          if (bVar1) {
            ares_close_connection(conn_00,ARES_SUCCESS);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ares_check_cleanup_conns(const ares_channel_t *channel)
{
  ares_slist_node_t *snode;

  if (channel == NULL) {
    return; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  /* Iterate across each server */
  for (snode = ares_slist_node_first(channel->servers); snode != NULL;
       snode = ares_slist_node_next(snode)) {
    ares_server_t     *server = ares_slist_node_val(snode);
    ares_llist_node_t *cnode;

    /* Iterate across each connection */
    cnode = ares_llist_node_first(server->connections);
    while (cnode != NULL) {
      ares_llist_node_t *next       = ares_llist_node_next(cnode);
      ares_conn_t       *conn       = ares_llist_node_val(cnode);
      ares_bool_t        do_cleanup = ARES_FALSE;
      cnode                         = next;

      /* Has connections, not eligible */
      if (ares_llist_len(conn->queries_to_conn)) {
        continue;
      }

      /* If we are configured not to stay open, close it out */
      if (!(channel->flags & ARES_FLAG_STAYOPEN)) {
        do_cleanup = ARES_TRUE;
      }

      /* If the associated server has failures, close it out. Resetting the
       * connection (and specifically the source port number) can help resolve
       * situations where packets are being dropped.
       */
      if (conn->server->consec_failures > 0) {
        do_cleanup = ARES_TRUE;
      }

      /* If the udp connection hit its max queries, always close it */
      if (!(conn->flags & ARES_CONN_FLAG_TCP) && channel->udp_max_queries > 0 &&
          conn->total_queries >= channel->udp_max_queries) {
        do_cleanup = ARES_TRUE;
      }

      if (!do_cleanup) {
        continue;
      }

      /* Clean it up */
      ares_close_connection(conn, ARES_SUCCESS);
    }
  }
}